

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

ON_Quaternion *
ON_Quaternion::Rotation(ON_Quaternion *__return_storage_ptr__,double angle,ON_3dVector *axis)

{
  double dVar1;
  double local_38;
  double s;
  ON_3dVector *axis_local;
  double angle_local;
  
  dVar1 = ON_3dVector::Length(axis);
  if (dVar1 <= 0.0) {
    local_38 = 0.0;
  }
  else {
    local_38 = sin(angle * 0.5);
    local_38 = local_38 / dVar1;
  }
  dVar1 = cos(angle * 0.5);
  ON_Quaternion(__return_storage_ptr__,dVar1,local_38 * axis->x,local_38 * axis->y,
                local_38 * axis->z);
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion ON_Quaternion::Rotation(double angle, const ON_3dVector& axis)
{
  double s = axis.Length();
  s = (s > 0.0) ? sin(0.5*angle)/s : 0.0;
  return ON_Quaternion(cos(0.5*angle),s*axis.x,s*axis.y,s*axis.z);
}